

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O3

void ApprovalTests::TestName::checkBuildConfiguration(string *fileName)

{
  bool bVar1;
  runtime_error *this;
  string sStack_38;
  
  if (checkBuildConfig_ == '\x01') {
    bVar1 = FileUtils::fileExists(fileName);
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      getMisconfiguredBuildHelp(&sStack_38,fileName);
      ::std::runtime_error::runtime_error(this,(string *)&sStack_38);
      __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void TestName::checkBuildConfiguration(const std::string& fileName)
    {
        if (checkBuildConfig_ && !FileUtils::fileExists(fileName))
        {
            throw std::runtime_error(getMisconfiguredBuildHelp(fileName));
        }
    }